

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::ParameterizedTestFactory<FastPForLib::FastPForTest_fastpack_64_noexcept_Test>::
~ParameterizedTestFactory
          (ParameterizedTestFactory<FastPForLib::FastPForTest_fastpack_64_noexcept_Test> *this)

{
  TestFactoryBase *in_RDI;
  
  in_RDI->_vptr_TestFactoryBase = (_func_int **)&PTR__ParameterizedTestFactory_00340ef8;
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  TestFactoryBase::~TestFactoryBase(in_RDI);
  return;
}

Assistant:

explicit ParameterizedTestFactory(ParamType parameter)
      : parameter_(parameter) {}